

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

OpenApiVersion
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetOpenApiVersion(ValueType *document)

{
  bool bVar1;
  SizeType SVar2;
  ConstMemberIterator CVar3;
  Ch *pCVar4;
  Pointer pVVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  OpenApiVersion OVar6;
  ValueType kVersion31Value;
  ValueType kVersion30Value;
  ValueType kVersion20Value;
  Data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  Pointer local_48;
  undefined8 uStack_40;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_30;
  
  if (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
      ::
      GetOpenApiVersion(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&)
      ::len == '\0') {
    GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::GetOpenApiVersion();
  }
  OVar6 = kVersionNone;
  if ((document->data_).f.flags == 3) {
    internal::
    Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
    ::GetSwaggerString();
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_48,document);
    pVVar5 = local_48;
    CVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(document);
    if (pVVar5 == CVar3.ptr_) {
      internal::
      Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      ::GetOpenApiString();
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_48,document);
      pVVar5 = local_48;
    }
    CVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(document);
    OVar6 = kVersionNone;
    if ((pVVar5 != CVar3.ptr_) &&
       (OVar6 = kVersionUnknown,
       (undefined1  [16])
       ((undefined1  [16])(pVVar5->value).data_ & (undefined1  [16])0x400000000000000) !=
       (undefined1  [16])0x0)) {
      rhs = &pVVar5->value;
      uStack_40 = 0x4050000001546c5;
      local_48 = (Pointer)0x3;
      bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&local_48,rhs);
      OVar6 = kVersion20;
      if (!bVar1) {
        uStack_50 = 0x4050000001546c9;
        local_58 = 4;
        SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(rhs);
        if (GetOpenApiVersion::len < SVar2) {
          pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(rhs);
          local_68.n = (Number)0x0;
          local_68.s.str = (Ch *)0x0;
          if (GetOpenApiVersion::len != 0 && pCVar4 == (Ch *)0x0) {
            __assert_fail("str != 0 || len == 0u",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                          ,0x19c,
                          "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                         );
          }
          if (pCVar4 == (Ch *)0x0) {
            pCVar4 = "";
          }
          local_68.s.str = (Ch *)((ulong)pCVar4 | 0x405000000000000);
          local_68.s.hashcode = 0;
          local_68.s.length = GetOpenApiVersion::len;
          bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&local_58,
                               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_68.s);
          if (bVar1) {
            return kVersion30;
          }
        }
        local_68.s.str = (Ch *)0x4050000001546ce;
        local_68.n = (Number)0x4;
        SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(rhs);
        OVar6 = kVersionUnknown;
        if (GetOpenApiVersion::len < SVar2) {
          pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(rhs);
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GenericValue(&local_30,pCVar4,GetOpenApiVersion::len);
          bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&local_68.s,&local_30);
          OVar6 = (uint)bVar1 + kVersionUnknown | kVersion31;
        }
      }
    }
  }
  return OVar6;
}

Assistant:

static OpenApiVersion GetOpenApiVersion(const ValueType& document) {
        static const Ch kVersion20String[] = { '2', '.', '0', '\0' };
        static const Ch kVersion30String[] = { '3', '.', '0', '.', '\0' }; // ignore patch level
        static const Ch kVersion31String[] = { '3', '.', '1', '.', '\0' }; // ignore patch level
        static SizeType len = internal::StrLen<Ch>(kVersion30String);

        if (!document.IsObject()) {
            return kVersionNone;
        }

        // Get the open api version from the swagger / openapi keyword at the supplied location
        typename ValueType::ConstMemberIterator itr = document.FindMember(SchemaType::GetSwaggerString());
        if (itr == document.MemberEnd()) itr = document.FindMember(SchemaType::GetOpenApiString());
        if (itr != document.MemberEnd()) {
            if (!itr->value.IsString()) return kVersionUnknown;
            const ValueType kVersion20Value(kVersion20String);
            if (kVersion20Value == itr->value) return kVersion20; // must match 2.0 exactly
            const ValueType kVersion30Value(kVersion30String);
            if (itr->value.GetStringLength() > len && kVersion30Value == ValueType(itr->value.GetString(), len)) return kVersion30; // must match 3.0.x
            const ValueType kVersion31Value(kVersion31String);
            if (itr->value.GetStringLength() > len && kVersion31Value == ValueType(itr->value.GetString(), len)) return kVersion31; // must match 3.1.x
            return kVersionUnknown;
        }
        // swagger or openapi not found
        return kVersionNone;
    }